

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_CCtx_setParams(ZSTD_CCtx *cctx,ZSTD_parameters params)

{
  ZSTD_compressionParameters cparams;
  undefined1 auVar1 [20];
  undefined4 in_EAX;
  int iVar2;
  size_t sVar3;
  ulong in_RCX;
  ZSTD_strategy unaff_EBX;
  ulong uVar4;
  undefined1 auVar5 [16];
  ZSTD_frameParameters fparams;
  undefined4 in_stack_ffffffffffffffe4;
  
  auVar5._0_4_ = -(uint)(0x7fffffe9 < (int)(params.cParams.windowLog - 0x20 ^ 0x80000000));
  auVar5._4_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.chainLog - 0x1f ^ 0x80000000));
  auVar5._8_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.hashLog - 0x1f ^ 0x80000000));
  auVar5._12_4_ = -(uint)(0x7fffffe1 < (int)(params.cParams.searchLog - 0x1f ^ 0x80000000));
  iVar2 = movmskps(in_EAX,auVar5);
  uVar4 = 0xffffffffffffffd6;
  if ((((iVar2 == 0xf) && (0xfffffffa < params.cParams.minMatch - 8)) &&
      (params.cParams.targetLength < 0x20001)) &&
     (in_RCX = 0, 0xfffffff6 < params.cParams.strategy + ~ZSTD_btultra2)) {
    uVar4 = in_RCX;
  }
  if ((uVar4 < 0xffffffffffffff89) &&
     (fparams.checksumFlag = 0, fparams.contentSizeFlag = params.fParams.noDictIDFlag,
     fparams.noDictIDFlag = (int)in_RCX,
     uVar4 = ZSTD_CCtx_setFParams((duckdb_zstd *)cctx,(ZSTD_CCtx *)params.fParams._0_8_,fparams),
     uVar4 < 0xffffffffffffff89)) {
    auVar1 = params.cParams._8_20_;
    cparams.targetLength = in_stack_ffffffffffffffe4;
    cparams.windowLog = auVar1._0_4_;
    cparams.chainLog = auVar1._4_4_;
    cparams.hashLog = auVar1._8_4_;
    cparams.searchLog = auVar1._12_4_;
    cparams.minMatch = auVar1._16_4_;
    cparams.strategy = unaff_EBX;
    sVar3 = ZSTD_CCtx_setCParams(cctx,cparams);
    uVar4 = 0;
    if (0xffffffffffffff88 < sVar3) {
      uVar4 = sVar3;
    }
  }
  return uVar4;
}

Assistant:

size_t ZSTD_CCtx_setParams(ZSTD_CCtx* cctx, ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParams");
    /* First check cParams, because we want to update all or none. */
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    /* Next set fParams, because this could fail if the cctx isn't in init stage. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setFParams(cctx, params.fParams), "");
    /* Finally set cParams, which should succeed. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setCParams(cctx, params.cParams), "");
    return 0;
}